

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low-level.cpp
# Opt level: O0

void __thiscall spatial_region::spatial_region(spatial_region *this)

{
  int iVar1;
  undefined4 *in_RDI;
  int PS;
  field3d<cellb> *in_stack_fffffffffffffeb8;
  field3d<cellb> *in_stack_fffffffffffffec0;
  field3d<cellb> *this_00;
  
  std::unique_ptr<maxwell_solver,std::default_delete<maxwell_solver>>::
  unique_ptr<std::default_delete<maxwell_solver>,void>
            ((unique_ptr<maxwell_solver,_std::default_delete<maxwell_solver>_> *)
             in_stack_fffffffffffffec0);
  std::function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)>::function
            ((function<void_(particle_&,_vector3d_&,_vector3d_&,_double_&)> *)
             in_stack_fffffffffffffec0);
  std::__cxx11::string::string((string *)(in_RDI + 0x4a));
  field3d<celle>::field3d((field3d<celle> *)in_stack_fffffffffffffec0);
  field3d<cellb>::field3d(in_stack_fffffffffffffec0);
  field3d<cellj>::field3d((field3d<cellj> *)in_stack_fffffffffffffec0);
  field3d<cellbe>::field3d((field3d<cellbe> *)in_stack_fffffffffffffec0);
  field3d<cellp>::field3d((field3d<cellp> *)in_stack_fffffffffffffec0);
  this_00 = (field3d<cellb> *)(in_RDI + 0x8c);
  std::vector<field3d<double>,_std::allocator<field3d<double>_>_>::vector
            ((vector<field3d<double>,_std::allocator<field3d<double>_>_> *)0x132be7);
  std::vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>::
  vector((vector<spatial_region::deleted_particle,_std::allocator<spatial_region::deleted_particle>_>
          *)0x132bfd);
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  *(undefined8 *)(in_RDI + 4) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 6) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 8) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 10) = 0x3fe0000000000000;
  in_RDI[0xc] = 1;
  in_RDI[0xd] = 1;
  in_RDI[0xe] = 1;
  *(undefined8 *)(in_RDI + 0x10) = 0x4202a05f20000000;
  field3d<celle>::field3d((field3d<celle> *)this_00);
  field3d<celle>::operator=((field3d<celle> *)this_00,(field3d<celle> *)in_stack_fffffffffffffeb8);
  field3d<celle>::~field3d((field3d<celle> *)this_00);
  field3d<cellj>::field3d((field3d<cellj> *)this_00);
  field3d<cellj>::operator=((field3d<cellj> *)this_00,(field3d<cellj> *)in_stack_fffffffffffffeb8);
  field3d<cellj>::~field3d((field3d<cellj> *)this_00);
  field3d<cellb>::field3d(this_00);
  field3d<cellb>::operator=(this_00,in_stack_fffffffffffffeb8);
  field3d<cellb>::~field3d(this_00);
  field3d<cellbe>::field3d((field3d<cellbe> *)this_00);
  field3d<cellbe>::operator=
            ((field3d<cellbe> *)this_00,(field3d<cellbe> *)in_stack_fffffffffffffeb8);
  field3d<cellbe>::~field3d((field3d<cellbe> *)this_00);
  field3d<cellp>::field3d((field3d<cellp> *)this_00);
  field3d<cellp>::operator=((field3d<cellp> *)this_00,(field3d<cellp> *)in_stack_fffffffffffffeb8);
  field3d<cellp>::~field3d((field3d<cellp> *)this_00);
  in_RDI[0x14] = 0;
  *(undefined8 *)(in_RDI + 0x42) = 0;
  *(undefined8 *)(in_RDI + 0x44) = 0;
  *(undefined8 *)(in_RDI + 0x46) = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x1d] = 0;
  iVar1 = getpagesize();
  if (iVar1 < 0x4000000) {
    in_RDI[0x1e] = 0x4000000;
  }
  else {
    iVar1 = getpagesize();
    in_RDI[0x1e] = iVar1;
  }
  in_RDI[0x1f] = 0x68;
  in_RDI[0x20] = 8;
  *(undefined8 *)(in_RDI + 0x52) = 0;
  *(undefined8 *)(in_RDI + 0x54) = 0;
  *(undefined8 *)(in_RDI + 0x56) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  in_RDI[0x16] = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x4a),"results");
  return;
}

Assistant:

spatial_region::spatial_region()
{
    nx = 0;
    ny = 0;
    nz = 0;
    dx = 1;
    dy = 1;
    dz = 1;
    dt = 0.5;
    xnpic = 1;
    ynpic = 1;
    znpic = 1;
    e_s = 1e10;
    ce = field3d<celle>();
    cj = field3d<cellj>();
    cb = field3d<cellb>();
    cbe = field3d<cellbe>();
    cp = field3d<cellp>();
    n_random = 0;
    energy_e_deleted = 0;
    energy_p_deleted = 0;
    energy_ph_deleted = 0;
    //
    n_ap = 0;
    n_f = 0;
    npwpa = 0;
    npwpo = 0;
    // page_size should not be very small to avoid OS problems with allocation
    const int PS = 64 * 1024 * 1024; // bytes
    if (getpagesize() < PS) {
        page_size = PS;
    } else {
        page_size = getpagesize();
    }
    particle_size = sizeof(particle);
    pointer_size = sizeof(particle*);
    p_lap = 0;
    pp_lfp = 0;
    p_lapwpa = 0;
    p_lapwpo = 0;
    n_ion_populations = 0;
    icmr = 0;
    data_folder = "results";
}